

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O0

void __thiscall inja::ParserStatic::~ParserStatic(ParserStatic *this)

{
  ParserStatic *this_local;
  
  FunctionStorage::~FunctionStorage(&this->functions);
  return;
}

Assistant:

ParserStatic() {
		functions.add_builtin("default", 2, Bytecode::Op::Default);
		functions.add_builtin("divisibleBy", 2, Bytecode::Op::DivisibleBy);
		functions.add_builtin("even", 1, Bytecode::Op::Even);
		functions.add_builtin("first", 1, Bytecode::Op::First);
		functions.add_builtin("float", 1, Bytecode::Op::Float);
		functions.add_builtin("int", 1, Bytecode::Op::Int);
		functions.add_builtin("last", 1, Bytecode::Op::Last);
		functions.add_builtin("length", 1, Bytecode::Op::Length);
		functions.add_builtin("lower", 1, Bytecode::Op::Lower);
		functions.add_builtin("max", 1, Bytecode::Op::Max);
		functions.add_builtin("min", 1, Bytecode::Op::Min);
		functions.add_builtin("odd", 1, Bytecode::Op::Odd);
		functions.add_builtin("range", 1, Bytecode::Op::Range);
		functions.add_builtin("round", 2, Bytecode::Op::Round);
		functions.add_builtin("sort", 1, Bytecode::Op::Sort);
		functions.add_builtin("upper", 1, Bytecode::Op::Upper);
		functions.add_builtin("exists", 1, Bytecode::Op::Exists);
		functions.add_builtin("existsIn", 2, Bytecode::Op::ExistsInObject);
		functions.add_builtin("isBoolean", 1, Bytecode::Op::IsBoolean);
		functions.add_builtin("isNumber", 1, Bytecode::Op::IsNumber);
		functions.add_builtin("isInteger", 1, Bytecode::Op::IsInteger);
		functions.add_builtin("isFloat", 1, Bytecode::Op::IsFloat);
		functions.add_builtin("isObject", 1, Bytecode::Op::IsObject);
		functions.add_builtin("isArray", 1, Bytecode::Op::IsArray);
		functions.add_builtin("isString", 1, Bytecode::Op::IsString);
	}